

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Shutdown(ImGuiContext *context)

{
  ImGuiContext *pIVar1;
  ImGuiContext *in_RDI;
  int i_1;
  int i;
  ImGuiContext *backup_context;
  ImGuiContext *backup_context_1;
  ImGuiContext *g;
  int local_28;
  int local_24;
  ImGuiContext *ctx;
  
  ctx = in_RDI;
  if (((in_RDI->IO).Fonts != (ImFontAtlas *)0x0) && ((in_RDI->FontAtlasOwnedByContext & 1U) != 0)) {
    ((in_RDI->IO).Fonts)->Locked = false;
    IM_DELETE<ImFontAtlas>((ImFontAtlas *)0x1a879d);
  }
  (ctx->IO).Fonts = (ImFontAtlas *)0x0;
  pIVar1 = GImGui;
  if ((ctx->Initialized & 1U) != 0) {
    if (((ctx->SettingsLoaded & 1U) != 0) && ((ctx->IO).IniFilename != (char *)0x0)) {
      SetCurrentContext(in_RDI);
      SaveIniSettingsToDisk(&ctx->Initialized);
      SetCurrentContext(pIVar1);
    }
    pIVar1 = GetCurrentContext();
    SetCurrentContext(in_RDI);
    DestroyPlatformWindows();
    SetCurrentContext(pIVar1);
    DockContextShutdown(ctx);
    for (local_24 = 0; local_24 < (ctx->Windows).Size; local_24 = local_24 + 1) {
      ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,local_24);
      IM_DELETE<ImGuiWindow>((ImGuiWindow *)0x1a8867);
    }
    ImVector<ImGuiWindow_*>::clear((ImVector<ImGuiWindow_*> *)pIVar1);
    ImVector<ImGuiWindow_*>::clear((ImVector<ImGuiWindow_*> *)pIVar1);
    ImVector<ImGuiWindow_*>::clear((ImVector<ImGuiWindow_*> *)pIVar1);
    ctx->CurrentWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiWindow_*>::clear((ImVector<ImGuiWindow_*> *)pIVar1);
    ImGuiStorage::Clear((ImGuiStorage *)0x1a88d9);
    ctx->NavWindow = (ImGuiWindow *)0x0;
    ctx->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    ctx->HoveredRootWindow = (ImGuiWindow *)0x0;
    ctx->HoveredWindow = (ImGuiWindow *)0x0;
    ctx->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
    ctx->ActiveIdWindow = (ImGuiWindow *)0x0;
    ctx->MovingWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiColorMod>::clear((ImVector<ImGuiColorMod> *)pIVar1);
    ImVector<ImGuiStyleMod>::clear((ImVector<ImGuiStyleMod> *)pIVar1);
    ImVector<ImFont_*>::clear((ImVector<ImFont_*> *)pIVar1);
    ImVector<ImGuiPopupData>::clear((ImVector<ImGuiPopupData> *)pIVar1);
    ImVector<ImGuiPopupData>::clear((ImVector<ImGuiPopupData> *)pIVar1);
    ctx->MouseLastHoveredViewport = (ImGuiViewportP *)0x0;
    ctx->MouseViewport = (ImGuiViewportP *)0x0;
    ctx->CurrentViewport = (ImGuiViewportP *)0x0;
    for (local_28 = 0; local_28 < (ctx->Viewports).Size; local_28 = local_28 + 1) {
      ImVector<ImGuiViewportP_*>::operator[](&ctx->Viewports,local_28);
      IM_DELETE<ImGuiViewportP>((ImGuiViewportP *)0x1a8a01);
    }
    ImVector<ImGuiViewportP_*>::clear((ImVector<ImGuiViewportP_*> *)pIVar1);
    ImPool<ImGuiTabBar>::Clear((ImPool<ImGuiTabBar> *)pIVar1);
    ImVector<ImGuiPtrOrIndex>::clear((ImVector<ImGuiPtrOrIndex> *)pIVar1);
    ImVector<ImGuiShrinkWidthItem>::clear((ImVector<ImGuiShrinkWidthItem> *)pIVar1);
    ImVector<char>::clear((ImVector<char> *)pIVar1);
    ImGuiInputTextState::ClearFreeMemory((ImGuiInputTextState *)pIVar1);
    ImChunkStream<ImGuiWindowSettings>::clear((ImChunkStream<ImGuiWindowSettings> *)0x1a8a83);
    ImVector<ImGuiSettingsHandler>::clear((ImVector<ImGuiSettingsHandler> *)pIVar1);
    if (ctx->LogFile != (ImFileHandle)0x0) {
      if (ctx->LogFile != _stdout) {
        ImFileClose((ImFileHandle)0x1a8acc);
      }
      ctx->LogFile = (ImFileHandle)0x0;
    }
    ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x1a8aed);
    ctx->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown(ImGuiContext* context)
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *context;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
    {
        ImGuiContext* backup_context = GImGui;
        SetCurrentContext(context);
        SaveIniSettingsToDisk(g.IO.IniFilename);
        SetCurrentContext(backup_context);
    }

    // Destroy platform windows
    ImGuiContext* backup_context = ImGui::GetCurrentContext();
    SetCurrentContext(context);
    DestroyPlatformWindows();
    SetCurrentContext(backup_context);

    // Shutdown extensions
    IM_ASSERT(g.DockContext != NULL);
    DockContextShutdown(&g);

    // Clear everything else
    for (int i = 0; i < g.Windows.Size; i++)
        IM_DELETE(g.Windows[i]);
    g.Windows.clear();
    g.WindowsFocusOrder.clear();
    g.WindowsSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;
    g.ColorModifiers.clear();
    g.StyleModifiers.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();

    g.CurrentViewport = g.MouseViewport = g.MouseLastHoveredViewport = NULL;
    for (int i = 0; i < g.Viewports.Size; i++)
        IM_DELETE(g.Viewports[i]);
    g.Viewports.clear();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.PrivateClipboard.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();

    g.Initialized = false;
}